

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O1

void JitFFI::SysV64::CreateCaller
               (JitFuncCreater *jfc,ArgumentInfo *argumentinfo,void *func,ArgDataList *adlist)

{
  _List_node_base **__src;
  ushort uVar1;
  uint *puVar2;
  long lVar3;
  ArgumentList *pAVar4;
  ArgumentList *pAVar5;
  JitFuncCreater *this;
  bool bVar6;
  uint uVar7;
  _List_node_base *p_Var8;
  _List_node_base *v;
  uint uVar9;
  ulong uVar10;
  OP OVar11;
  uint uVar12;
  _List_node_base *p_Var13;
  JitFuncCallerCreater jfcc;
  ArgumentList list;
  JitFuncCallerCreater local_b0;
  ArgumentList local_88;
  void *local_50;
  JitFuncCreater *local_48;
  Data local_40;
  
  if (0xfffffffe <
      (adlist->super__List_base<const_void_*,_std::allocator<const_void_*>_>)._M_impl._M_node.
      _M_size) {
    __assert_fail("adlist.size() < UINT32_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                  ,0x3f6,
                  "void JitFFI::SysV64::CreateCaller(JitFuncCreater &, const ArgumentInfo &, void *, const ArgDataList &)"
                 );
  }
  local_48 = jfc;
  if (argumentinfo->_platform != P_SysV64) {
    __assert_fail("P == _platform",
                  "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/argument.h"
                  ,0x42,
                  "const T &JitFFI::ArgumentInfo::data() const [P = JitFFI::P_SysV64, T = JitFFI::SysV64::ArgTypeInfo]"
                 );
  }
  puVar2 = (uint *)(argumentinfo->_data).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  local_88.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_88;
  local_88.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
  ._M_impl._M_node._M_size = 0;
  local_88.counter.int_count = 0;
  local_88.counter.float_count = 0;
  local_88.counter.memory_count = 0;
  local_88.retdata.type = '\0';
  local_88.retdata.std.super_StructBaseData = (StructBaseData)0x0;
  local_88.retdata.size = 0;
  local_88.count = 0;
  p_Var13 = (adlist->super__List_base<const_void_*,_std::allocator<const_void_*>_>)._M_impl._M_node.
            super__List_node_base._M_next;
  local_88.datalist.data.c.
  super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       local_88.datalist.data.c.
       super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if ((char)puVar2[1] == '\n') {
    ArgumentList::push(&local_88,op_void,0);
  }
  local_88.retdata = *(RetData *)(puVar2 + 1);
  local_50 = func;
  if (*puVar2 != 0) {
    uVar9 = 0;
    do {
      uVar10 = (ulong)uVar9;
      if (*(ulong *)(puVar2 + 4) <= uVar10) {
        __assert_fail("id < num",
                      "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-def.h"
                      ,0x7c,
                      "T &JitFFI::UPtrValVector<JitFFI::SysV64::ArgTypeInfo::PassData>::operator[](size_t) const [T = JitFFI::SysV64::ArgTypeInfo::PassData]"
                     );
      }
      lVar3 = *(long *)(puVar2 + 2);
      switch(*(undefined1 *)(lVar3 + uVar10 * 4)) {
      case 1:
        p_Var8 = p_Var13[1]._M_next;
        uVar1 = *(ushort *)(lVar3 + 2 + uVar10 * 4);
        switch(uVar1) {
        case 1:
          p_Var8 = (_List_node_base *)(ulong)*(byte *)&p_Var8->_M_next;
          break;
        case 2:
          p_Var8 = (_List_node_base *)(ulong)*(ushort *)&p_Var8->_M_next;
          break;
        default:
          if (8 < uVar1) {
LAB_0010b972:
            __assert_fail("n <= 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-def.h"
                          ,0x4f,"uint64_t JitFFI::convert_uint64(const void *, size_t)");
          }
          local_b0.super_JitFuncCallerCreaterX64.data = (JitFuncCreater *)0x0;
          memcpy(&local_b0,p_Var8,(ulong)uVar1);
          p_Var8 = (_List_node_base *)local_b0.super_JitFuncCallerCreaterX64.data;
          break;
        case 4:
          p_Var8 = (_List_node_base *)(ulong)*(uint *)&p_Var8->_M_next;
          break;
        case 8:
          p_Var8 = p_Var8->_M_next;
        }
        OVar11 = op_int;
        goto LAB_0010b6b8;
      case 2:
        p_Var8 = p_Var13[1]._M_next;
        uVar1 = *(ushort *)(lVar3 + 2 + uVar10 * 4);
        switch(uVar1) {
        case 1:
          p_Var8 = (_List_node_base *)(ulong)*(byte *)&p_Var8->_M_next;
          break;
        case 2:
          p_Var8 = (_List_node_base *)(ulong)*(ushort *)&p_Var8->_M_next;
          break;
        default:
          if (8 < uVar1) goto LAB_0010b972;
          local_b0.super_JitFuncCallerCreaterX64.data = (JitFuncCreater *)0x0;
          memcpy(&local_b0,p_Var8,(ulong)uVar1);
          p_Var8 = (_List_node_base *)local_b0.super_JitFuncCallerCreaterX64.data;
          break;
        case 4:
          p_Var8 = (_List_node_base *)(ulong)*(uint *)&p_Var8->_M_next;
          break;
        case 8:
          p_Var8 = p_Var8->_M_next;
        }
        OVar11 = op_float;
LAB_0010b6b8:
        ArgumentList::push(&local_88,OVar11,(uint64_t)p_Var8);
        break;
      case 3:
        ArgumentList::push_memory
                  (&local_88,p_Var13[1]._M_next,(ulong)*(ushort *)(lVar3 + 2 + uVar10 * 4));
        break;
      case 4:
        uVar1 = *(ushort *)(lVar3 + 2 + uVar10 * 4);
        if (0x10 < uVar1) {
          __assert_fail("size <= 16",
                        "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                        ,0x2f2,
                        "void JitFFI::SysV64::push_struct_data(ArgumentList &, const void *, const ArgTypeInfo::StructPassData &, unsigned int)"
                       );
        }
        p_Var8 = p_Var13[1]._M_next;
        uVar12 = (uint)uVar1;
        if (uVar1 != 0) {
          OVar11 = *(OP *)(lVar3 + 1 + uVar10 * 4);
          uVar7 = 8;
          if (uVar12 < 8) {
            uVar7 = uVar12;
          }
          switch(uVar7) {
          case 1:
            v = (_List_node_base *)(ulong)*(byte *)&p_Var8->_M_next;
            break;
          case 2:
            v = (_List_node_base *)(ulong)*(ushort *)&p_Var8->_M_next;
            break;
          default:
            local_b0.super_JitFuncCallerCreaterX64.data = (JitFuncCreater *)0x0;
            memcpy(&local_b0,p_Var8,(ulong)uVar7);
            v = (_List_node_base *)local_b0.super_JitFuncCallerCreaterX64.data;
            break;
          case 4:
            v = (_List_node_base *)(ulong)*(uint *)&p_Var8->_M_next;
            break;
          case 8:
            v = p_Var8->_M_next;
          }
          ArgumentList::push(&local_88,OVar11 & 0xf,(uint64_t)v);
        }
        if (8 < uVar1) {
          OVar11 = *(byte *)(lVar3 + 1 + uVar10 * 4) >> 4;
          __src = &p_Var8->_M_prev;
          switch(uVar1) {
          case 9:
            p_Var8 = (_List_node_base *)(ulong)*(byte *)__src;
            break;
          case 10:
            p_Var8 = (_List_node_base *)(ulong)*(ushort *)__src;
            break;
          default:
            if (8 < uVar12 - 8) goto LAB_0010b972;
            local_b0.super_JitFuncCallerCreaterX64.data = (JitFuncCreater *)0x0;
            memcpy(&local_b0,__src,(ulong)(uVar12 - 8));
            p_Var8 = (_List_node_base *)local_b0.super_JitFuncCallerCreaterX64.data;
            break;
          case 0xc:
            p_Var8 = (_List_node_base *)(ulong)*(uint *)__src;
            break;
          case 0x10:
            p_Var8 = *__src;
          }
          goto LAB_0010b6b8;
        }
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                      ,0x313,
                      "ArgumentList JitFFI::SysV64::create_argumentlist(const ArgTypeInfo &, const ArgDataList &)"
                     );
      }
      p_Var13 = p_Var13->_M_next;
      uVar9 = uVar9 + 1;
    } while (uVar9 != *puVar2);
  }
  this = local_48;
  local_b0.super_JitFuncCallerCreaterX64.data = local_48;
  local_b0.super_JitFuncCallerCreaterX64.push_count = 0;
  local_b0.super_JitFuncCallerCreaterX64.sub_rsp_ptr = (byte *)0x0;
  local_b0.super_JitFuncCallerCreaterX64.have_init = false;
  local_b0.super_JitFuncCallerCreaterX64._28_4_ = 0;
  local_b0.addarg_double_count = 0;
  create_function_caller_head(&local_b0);
  JitFuncCreater::push(this,'H');
  JitFuncCreater::push(this,0x89);
  JitFuncCreater::push(this,0xfb);
  local_b0.addarg_double_count = local_88.counter.float_count;
  local_b0.super_JitFuncCallerCreaterX64._28_4_ = local_88.counter.int_count;
  local_b0.super_JitFuncCallerCreaterX64.have_init = true;
  bVar6 = StackList<JitFFI::SysV64::ArgumentList::Data>::get_next(&local_88.datalist,&local_40);
  if (bVar6) {
    do {
      switch((ulong)local_40.op) {
      case 0:
        break;
      case 1:
        JitFuncCallerCreater::add_int(&local_b0,local_40.data);
        break;
      case 2:
        JitFuncCallerCreater::add_double(&local_b0,local_40.data);
        break;
      case 3:
        JitFuncCallerCreaterX64::push(&local_b0.super_JitFuncCallerCreaterX64,local_40.data);
        break;
      default:
        printf("%d\n",(ulong)local_40.op);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                      ,0x338,
                      "void JitFFI::SysV64::create_argument(JitFuncCallerCreater &, ArgumentList &)"
                     );
      }
      bVar6 = StackList<JitFFI::SysV64::ArgumentList::Data>::get_next(&local_88.datalist,&local_40);
    } while (bVar6);
  }
  JitFuncCallerCreater::call(&local_b0,local_50);
  create_return(&local_b0,&local_88.retdata);
  create_function_caller_foot(&local_b0);
  pAVar5 = (ArgumentList *)
           local_88.datalist.data.c.
           super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  while (pAVar5 != &local_88) {
    pAVar4 = (ArgumentList *)
             (pAVar5->datalist).data.c.
             super__List_base<JitFFI::SysV64::ArgumentList::Data,_std::allocator<JitFFI::SysV64::ArgumentList::Data>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    operator_delete(pAVar5,0x20);
    pAVar5 = pAVar4;
  }
  return;
}

Assistant:

void CreateCaller(JitFuncCreater &jfc, const ArgumentInfo &argumentinfo, void *func, const ArgDataList &adlist)
		{
			assert(adlist.size() < UINT32_MAX);

			ArgumentList list = create_argumentlist(get_argtypeinfo(argumentinfo), adlist);

			//printf("<");
			//for (auto &e : list.list) {
			//	printf("(%d 0x%llX)\n", e.type, e.data);
			//}
			//printf(">\n");

			JitFuncCallerCreater jfcc(jfc);
			create_function_caller_head(jfcc);

			mov(jfc, rbx, rdi);
			create_argument(jfcc, list);

			jfcc.call(func);

			create_return(jfcc, list.get_retdata());

			create_function_caller_foot(jfcc);
		}